

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O1

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)

{
  uint uVar1;
  MOJOSHADER_symbolRegisterSet MVar2;
  uint uVar3;
  MOJOSHADER_effectParam *pMVar4;
  MOJOSHADER_effectStateChanges *pMVar5;
  uint *puVar6;
  MOJOSHADER_symbol *pMVar7;
  MOJOSHADER_preshader *pMVar8;
  float *pfVar9;
  bool bVar10;
  GLfloat *pGVar11;
  MOJOSHADER_glContext *pMVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  long lVar16;
  MOJOSHADER_effectObject *pMVar17;
  ulong uVar18;
  MOJOSHADER_effectObject *pMVar19;
  float *pfVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  float selector;
  float local_3c;
  GLfloat *local_38;
  
  pMVar19 = (MOJOSHADER_effectObject *)glEffect->current_vert_raw;
  pMVar17 = (MOJOSHADER_effectObject *)glEffect->current_frag_raw;
  bVar10 = false;
  if (pMVar19 == (MOJOSHADER_effectObject *)0x0) {
    pMVar19 = (MOJOSHADER_effectObject *)0x0;
  }
  else if (*(uint *)((long)pMVar19 + 0xc) != 0) {
    uVar18 = 0;
    do {
      pMVar4 = glEffect->effect->params;
      uVar1 = (*(uint **)((long)pMVar19 + 0x18))[uVar18];
      if (3 < pMVar4[uVar1].value.value_count) {
        iVar26 = 0;
        uVar27 = 0;
        do {
          memcpy(((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar19 + 0x40))
                 ->preshader->registers +
                 ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar19 + 0x40))
                 ->preshader->symbols[uVar18].register_index + uVar27,
                 (void *)((long)iVar26 * 4 + (long)pMVar4[uVar1].value.field_4.values),
                 (ulong)(pMVar4[uVar1].value.type.columns << 2));
          uVar27 = uVar27 + 1;
          iVar26 = iVar26 + 4;
        } while (uVar27 < pMVar4[uVar1].value.value_count >> 2);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                      ((long)pMVar19 + 0x40))->preshader->symbol_count);
    MOJOSHADER_runPreshader
              (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar19 + 0x40))->
               preshader,&local_3c);
    uVar1 = *(uint *)((long)glEffect->effect->params[**(uint **)((long)pMVar19 + 0x28)].value.
                            field_4.values + (long)(int)local_3c * 4);
    pMVar19 = glEffect->effect->objects + (int)uVar1;
    lVar16 = 0;
    uVar18 = 0;
    do {
      if (uVar1 == glEffect->shader_indices[uVar18]) {
        glEffect->current_vert =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar16);
        break;
      }
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar18 < glEffect->num_shaders);
    bVar10 = true;
  }
  if (pMVar17 == (MOJOSHADER_effectObject *)0x0) {
    pMVar17 = (MOJOSHADER_effectObject *)0x0;
  }
  else if (*(uint *)((long)pMVar17 + 0xc) != 0) {
    uVar18 = 0;
    do {
      pMVar4 = glEffect->effect->params;
      uVar1 = (*(uint **)((long)pMVar17 + 0x18))[uVar18];
      if (3 < pMVar4[uVar1].value.value_count) {
        iVar26 = 0;
        uVar27 = 0;
        do {
          memcpy(((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar17 + 0x40))
                 ->preshader->registers +
                 ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar17 + 0x40))
                 ->preshader->symbols[uVar18].register_index + uVar27,
                 (void *)((long)iVar26 * 4 + (long)pMVar4[uVar1].value.field_4.values),
                 (ulong)(pMVar4[uVar1].value.type.columns << 2));
          uVar27 = uVar27 + 1;
          iVar26 = iVar26 + 4;
        } while (uVar27 < pMVar4[uVar1].value.value_count >> 2);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                      ((long)pMVar17 + 0x40))->preshader->symbol_count);
    MOJOSHADER_runPreshader
              (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar17 + 0x40))->
               preshader,&local_3c);
    uVar1 = *(uint *)((long)glEffect->effect->params[**(uint **)((long)pMVar17 + 0x28)].value.
                            field_4.values + (long)(int)local_3c * 4);
    pMVar17 = glEffect->effect->objects + (int)uVar1;
    lVar16 = 0;
    uVar18 = 0;
    do {
      if (uVar1 == glEffect->shader_indices[uVar18]) {
        glEffect->current_frag =
             (MOJOSHADER_glShader *)((long)&glEffect->shaders->parseData + lVar16);
        break;
      }
      uVar18 = uVar18 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar18 < glEffect->num_shaders);
    bVar10 = true;
  }
  if (bVar10) {
    MOJOSHADER_glBindShaders(glEffect->current_vert,glEffect->current_frag);
    if (glEffect->current_vert_raw != (MOJOSHADER_effectShader *)0x0) {
      pMVar5 = glEffect->effect->state_changes;
      pMVar5->vertex_sampler_state_changes =
           *(MOJOSHADER_samplerStateRegister **)((long)pMVar19 + 0x38);
      pMVar5->vertex_sampler_state_change_count = *(uint *)((long)pMVar19 + 0x30);
    }
    if (glEffect->current_frag_raw != (MOJOSHADER_effectShader *)0x0) {
      pMVar5 = glEffect->effect->state_changes;
      pMVar5->sampler_state_changes = *(MOJOSHADER_samplerStateRegister **)((long)pMVar17 + 0x38);
      pMVar5->sampler_state_change_count = *(uint *)((long)pMVar17 + 0x30);
    }
  }
  pMVar12 = ctx;
  if (pMVar19 != (MOJOSHADER_effectObject *)0x0) {
    uVar18 = (ulong)(uint)((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                          ((long)pMVar19 + 0x40))->shader->symbol_count;
    if (uVar18 != 0) {
      pMVar4 = glEffect->effect->params;
      puVar6 = *(uint **)((long)pMVar19 + 0x28);
      pMVar7 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar19 + 0x40))->
               shader->symbols;
      local_38 = (GLfloat *)ctx->vs_reg_file_i;
      uVar27 = 0;
      do {
        uVar1 = puVar6[uVar27];
        uVar13 = pMVar7[uVar27].register_index;
        uVar25 = (ulong)(uVar13 * 4);
        if (pMVar4[uVar1].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0012a05a:
          pGVar11 = pMVar12->vs_reg_file_f;
LAB_0012a060:
          memcpy(pGVar11 + uVar25,pMVar4[uVar1].value.field_4.values,
                 (ulong)(pMVar7[uVar27].register_count << 4));
        }
        else {
          MVar2 = pMVar7[uVar27].register_set;
          if (MVar2 == MOJOSHADER_SYMREGSET_FLOAT4) {
            if (pMVar4[uVar1].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
            goto LAB_0012a05a;
            uVar13 = pMVar4[uVar1].value.type.columns;
            uVar14 = pMVar7[uVar27].register_count;
            iVar26 = 0;
            uVar21 = 0;
            do {
              lVar16 = (long)iVar26;
              iVar15 = (int)uVar25;
              uVar24 = (ulong)(uVar13 + (uVar13 == 0));
              do {
                pMVar12->vs_reg_file_f[uVar25] =
                     (float)*(int *)((long)pMVar4[uVar1].value.field_4.values + lVar16 * 4);
                uVar25 = (ulong)((int)uVar25 + 1);
                lVar16 = lVar16 + 1;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
              uVar21 = uVar21 + 1;
              uVar25 = (ulong)(iVar15 + 4);
              iVar26 = iVar26 + 4;
            } while (uVar21 != uVar14 + (uVar14 == 0));
          }
          else {
            pGVar11 = local_38;
            if (MVar2 == MOJOSHADER_SYMREGSET_INT4) goto LAB_0012a060;
            if (MVar2 == MOJOSHADER_SYMREGSET_BOOL) {
              iVar26 = 0;
              uVar14 = 0;
              do {
                uVar25 = 1;
                do {
                  uVar22 = uVar14;
                  pMVar12->vs_reg_file_b[(uVar13 & 0x3fffffff) + uVar22] =
                       *(uint8 *)((long)pMVar4[uVar1].value.field_4.values +
                                 uVar25 * 4 + (long)iVar26 * 4 + -4);
                  if (pMVar4[uVar1].value.type.columns <= uVar25) break;
                  uVar25 = uVar25 + 1;
                  uVar14 = uVar22 + 1;
                } while (uVar22 + 1 < pMVar7[uVar27].register_count);
                uVar14 = uVar22 + 1;
                iVar26 = iVar26 + 4;
              } while (uVar14 < pMVar7[uVar27].register_count);
            }
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar18);
    }
    pMVar8 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar19 + 0x40))->
             shader->preshader;
    if (pMVar8 != (MOJOSHADER_preshader *)0x0) {
      uVar1 = pMVar8->symbol_count;
      if ((ulong)uVar1 != 0) {
        pMVar4 = glEffect->effect->params;
        puVar6 = *(uint **)((long)pMVar19 + 0x18);
        pMVar7 = pMVar8->symbols;
        pfVar9 = pMVar8->registers;
        uVar18 = 0;
        do {
          uVar13 = puVar6[uVar18];
          uVar14 = pMVar7[uVar18].register_index << 2;
          if (pMVar4[uVar13].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0012a1ce:
            pfVar20 = pfVar9 + uVar14;
LAB_0012a1d4:
            memcpy(pfVar20,pMVar4[uVar13].value.field_4.values,
                   (ulong)(pMVar7[uVar18].register_count << 4));
          }
          else {
            MVar2 = pMVar7[uVar18].register_set;
            if (MVar2 == MOJOSHADER_SYMREGSET_FLOAT4) {
              if (pMVar4[uVar13].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
              goto LAB_0012a1ce;
              uVar22 = pMVar4[uVar13].value.type.columns;
              uVar3 = pMVar7[uVar18].register_count;
              iVar26 = 0;
              uVar27 = 0;
              do {
                lVar16 = (long)iVar26;
                uVar25 = (ulong)(uVar22 + (uVar22 == 0));
                uVar23 = uVar14;
                do {
                  pfVar9[uVar23] =
                       (float)*(int *)((long)pMVar4[uVar13].value.field_4.values + lVar16 * 4);
                  uVar23 = uVar23 + 1;
                  lVar16 = lVar16 + 1;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
                uVar27 = uVar27 + 1;
                uVar14 = uVar14 + 4;
                iVar26 = iVar26 + 4;
              } while (uVar27 != uVar3 + (uVar3 == 0));
            }
            else {
              if (MVar2 == MOJOSHADER_SYMREGSET_INT4) {
                pfVar20 = (float *)((ulong)uVar14 << 2);
                goto LAB_0012a1d4;
              }
              if (MVar2 == MOJOSHADER_SYMREGSET_BOOL) {
                uVar13 = pMVar4[uVar13].value.type.columns;
                uVar13 = uVar13 + (uVar13 == 0);
                uVar14 = 0;
                do {
                  uVar27 = 0;
                  do {
                    if ((ulong)uVar13 - 1 == uVar27) {
                      uVar27 = (ulong)uVar13;
                      break;
                    }
                    uVar27 = uVar27 + 1;
                  } while ((int)uVar27 + uVar14 < pMVar7[uVar18].register_count);
                  uVar14 = uVar14 + (int)uVar27;
                } while (uVar14 < pMVar7[uVar18].register_count);
              }
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar1);
      }
      MOJOSHADER_runPreshader
                (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar19 + 0x40))
                 ->shader->preshader,ctx->vs_reg_file_f);
    }
  }
  pMVar12 = ctx;
  if (pMVar17 != (MOJOSHADER_effectObject *)0x0) {
    uVar18 = (ulong)(uint)((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)
                          ((long)pMVar17 + 0x40))->shader->symbol_count;
    if (uVar18 != 0) {
      pMVar4 = glEffect->effect->params;
      puVar6 = *(uint **)((long)pMVar17 + 0x28);
      pMVar7 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar17 + 0x40))->
               shader->symbols;
      uVar27 = 0;
      do {
        uVar1 = puVar6[uVar27];
        uVar13 = pMVar7[uVar27].register_index;
        uVar25 = (ulong)(uVar13 * 4);
        if (pMVar4[uVar1].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0012a350:
          pGVar11 = pMVar12->ps_reg_file_f;
LAB_0012a356:
          memcpy(pGVar11 + uVar25,pMVar4[uVar1].value.field_4.values,
                 (ulong)(pMVar7[uVar27].register_count << 4));
        }
        else {
          MVar2 = pMVar7[uVar27].register_set;
          if (MVar2 == MOJOSHADER_SYMREGSET_FLOAT4) {
            if (pMVar4[uVar1].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
            goto LAB_0012a350;
            uVar13 = pMVar4[uVar1].value.type.columns;
            uVar14 = pMVar7[uVar27].register_count;
            iVar26 = 0;
            uVar21 = 0;
            do {
              lVar16 = (long)iVar26;
              iVar15 = (int)uVar25;
              uVar24 = (ulong)(uVar13 + (uVar13 == 0));
              do {
                pMVar12->ps_reg_file_f[uVar25] =
                     (float)*(int *)((long)pMVar4[uVar1].value.field_4.values + lVar16 * 4);
                uVar25 = (ulong)((int)uVar25 + 1);
                lVar16 = lVar16 + 1;
                uVar24 = uVar24 - 1;
              } while (uVar24 != 0);
              uVar21 = uVar21 + 1;
              uVar25 = (ulong)(iVar15 + 4);
              iVar26 = iVar26 + 4;
            } while (uVar21 != uVar14 + (uVar14 == 0));
          }
          else {
            if (MVar2 == MOJOSHADER_SYMREGSET_INT4) {
              pGVar11 = (GLfloat *)pMVar12->ps_reg_file_i;
              goto LAB_0012a356;
            }
            if (MVar2 == MOJOSHADER_SYMREGSET_BOOL) {
              iVar26 = 0;
              uVar14 = 0;
              do {
                uVar25 = 1;
                do {
                  uVar22 = uVar14;
                  pMVar12->ps_reg_file_b[(uVar13 & 0x3fffffff) + uVar22] =
                       *(uint8 *)((long)pMVar4[uVar1].value.field_4.values +
                                 uVar25 * 4 + (long)iVar26 * 4 + -4);
                  if (pMVar4[uVar1].value.type.columns <= uVar25) break;
                  uVar25 = uVar25 + 1;
                  uVar14 = uVar22 + 1;
                } while (uVar22 + 1 < pMVar7[uVar27].register_count);
                uVar14 = uVar22 + 1;
                iVar26 = iVar26 + 4;
              } while (uVar14 < pMVar7[uVar27].register_count);
            }
          }
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar18);
    }
    pMVar8 = ((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar17 + 0x40))->
             shader->preshader;
    if (pMVar8 != (MOJOSHADER_preshader *)0x0) {
      uVar1 = pMVar8->symbol_count;
      if ((ulong)uVar1 != 0) {
        pMVar4 = glEffect->effect->params;
        puVar6 = *(uint **)((long)pMVar17 + 0x18);
        pMVar7 = pMVar8->symbols;
        pfVar9 = pMVar8->registers;
        uVar18 = 0;
        do {
          uVar13 = puVar6[uVar18];
          uVar14 = pMVar7[uVar18].register_index << 2;
          if (pMVar4[uVar13].value.type.parameter_type == MOJOSHADER_SYMTYPE_FLOAT) {
LAB_0012a4c1:
            pfVar20 = pfVar9 + uVar14;
LAB_0012a4ce:
            memcpy(pfVar20,pMVar4[uVar13].value.field_4.values,
                   (ulong)(pMVar7[uVar18].register_count << 4));
          }
          else {
            MVar2 = pMVar7[uVar18].register_set;
            if (MVar2 == MOJOSHADER_SYMREGSET_FLOAT4) {
              if (pMVar4[uVar13].value.type.parameter_class == MOJOSHADER_SYMCLASS_STRUCT)
              goto LAB_0012a4c1;
              uVar22 = pMVar4[uVar13].value.type.columns;
              uVar3 = pMVar7[uVar18].register_count;
              iVar26 = 0;
              uVar27 = 0;
              do {
                lVar16 = (long)iVar26;
                uVar25 = (ulong)(uVar22 + (uVar22 == 0));
                uVar23 = uVar14;
                do {
                  pfVar9[uVar23] =
                       (float)*(int *)((long)pMVar4[uVar13].value.field_4.values + lVar16 * 4);
                  uVar23 = uVar23 + 1;
                  lVar16 = lVar16 + 1;
                  uVar25 = uVar25 - 1;
                } while (uVar25 != 0);
                uVar27 = uVar27 + 1;
                uVar14 = uVar14 + 4;
                iVar26 = iVar26 + 4;
              } while (uVar27 != uVar3 + (uVar3 == 0));
            }
            else {
              if (MVar2 == MOJOSHADER_SYMREGSET_INT4) {
                pfVar20 = (float *)((ulong)uVar14 << 2);
                goto LAB_0012a4ce;
              }
              if (MVar2 == MOJOSHADER_SYMREGSET_BOOL) {
                uVar13 = pMVar4[uVar13].value.type.columns;
                uVar13 = uVar13 + (uVar13 == 0);
                uVar14 = 0;
                do {
                  uVar27 = 0;
                  do {
                    if ((ulong)uVar13 - 1 == uVar27) {
                      uVar27 = (ulong)uVar13;
                      break;
                    }
                    uVar27 = uVar27 + 1;
                  } while ((int)uVar27 + uVar14 < pMVar7[uVar18].register_count);
                  uVar14 = uVar14 + (int)uVar27;
                } while (uVar14 < pMVar7[uVar18].register_count);
              }
            }
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 != uVar1);
      }
      MOJOSHADER_runPreshader
                (((anon_union_8_2_659cdb1c_for_MOJOSHADER_effectShader_10 *)((long)pMVar17 + 0x40))
                 ->shader->preshader,ctx->ps_reg_file_f);
    }
  }
  ctx->generation = ctx->generation + 1;
  return;
}

Assistant:

void MOJOSHADER_glEffectCommitChanges(MOJOSHADER_glEffect *glEffect)
{
    MOJOSHADER_effectShader *rawVert = glEffect->current_vert_raw;
    MOJOSHADER_effectShader *rawFrag = glEffect->current_frag_raw;

    /* Used for shader selection from preshaders */
    int i, j;
    MOJOSHADER_effectValue *param;
    float selector;
    int shader_object;
    int selector_ran = 0;

    /* For effect passes with arrays of shaders, we have to run a preshader
     * that determines which shader to use, based on a parameter's value.
     * -flibit
     */
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    #define SELECT_SHADER_FROM_PRESHADER(raw, gls) \
        if (raw != NULL && raw->is_preshader) \
        { \
            i = 0; \
            do \
            { \
                param = &glEffect->effect->params[raw->preshader_params[i]].value; \
                for (j = 0; j < (param->value_count >> 2); j++) \
                    memcpy(raw->preshader->registers + raw->preshader->symbols[i].register_index + j, \
                           param->valuesI + (j << 2), \
                           param->type.columns << 2); \
            } while (++i < raw->preshader->symbol_count); \
            MOJOSHADER_runPreshader(raw->preshader, &selector); \
            shader_object = glEffect->effect->params[raw->params[0]].value.valuesI[(int) selector]; \
            raw = &glEffect->effect->objects[shader_object].shader; \
            i = 0; \
            do \
            { \
                if (shader_object == glEffect->shader_indices[i]) \
                { \
                    gls = &glEffect->shaders[i]; \
                    break; \
                } \
            } while (++i < glEffect->num_shaders); \
            selector_ran = 1; \
        }
    SELECT_SHADER_FROM_PRESHADER(rawVert, glEffect->current_vert)
    SELECT_SHADER_FROM_PRESHADER(rawFrag, glEffect->current_frag)
    #undef SELECT_SHADER_FROM_PRESHADER
    if (selector_ran)
    {
        MOJOSHADER_glBindShaders(glEffect->current_vert,
                                 glEffect->current_frag);
        if (glEffect->current_vert_raw != NULL)
        {
            glEffect->effect->state_changes->vertex_sampler_state_changes = rawVert->samplers;
            glEffect->effect->state_changes->vertex_sampler_state_change_count = rawVert->sampler_count;
        } // if
        if (glEffect->current_frag_raw != NULL)
        {
            glEffect->effect->state_changes->sampler_state_changes = rawFrag->samplers;
            glEffect->effect->state_changes->sampler_state_change_count = rawFrag->sampler_count;
        } // if
    } // if

    /* This is where parameters are copied into the constant buffers.
     * If you're looking for where things slow down immensely, look at
     * the copy_parameter_data() and MOJOSHADER_runPreshader() functions.
     * -flibit
     */
    // !!! FIXME: We're just copying everything every time. Blech. -flibit
    // !!! FIXME: We're just running the preshaders every time. Blech. -flibit
    // !!! FIXME: Will the preshader ever want int/bool registers? -flibit
    #define COPY_PARAMETER_DATA(raw, stage) \
        if (raw != NULL) \
        { \
            copy_parameter_data(glEffect->effect->params, raw->params, \
                                raw->shader->symbols, \
                                raw->shader->symbol_count, \
                                ctx->stage##_reg_file_f, \
                                ctx->stage##_reg_file_i, \
                                ctx->stage##_reg_file_b); \
            if (raw->shader->preshader) \
            { \
                copy_parameter_data(glEffect->effect->params, raw->preshader_params, \
                                    raw->shader->preshader->symbols, \
                                    raw->shader->preshader->symbol_count, \
                                    raw->shader->preshader->registers, \
                                    NULL, \
                                    NULL); \
                MOJOSHADER_runPreshader(raw->shader->preshader, ctx->stage##_reg_file_f); \
            } \
        }
    COPY_PARAMETER_DATA(rawVert, vs)
    COPY_PARAMETER_DATA(rawFrag, ps)
    #undef COPY_PARAMETER_DATA

    ctx->generation++;
}